

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pngwrite.c
# Opt level: O0

void png_set_compression_window_bits(png_structrp png_ptr,int window_bits)

{
  int local_14;
  int window_bits_local;
  png_structrp png_ptr_local;
  
  if (png_ptr != (png_structrp)0x0) {
    if (window_bits < 0x10) {
      local_14 = window_bits;
      if (window_bits < 8) {
        png_warning(png_ptr,"Only compression windows >= 256 supported by PNG");
        local_14 = 8;
      }
    }
    else {
      png_warning(png_ptr,"Only compression windows <= 32k supported by PNG");
      local_14 = 0xf;
    }
    png_ptr->zlib_window_bits = local_14;
  }
  return;
}

Assistant:

void PNGAPI
png_set_compression_window_bits(png_structrp png_ptr, int window_bits)
{
   png_debug(1, "in png_set_compression_window_bits");

   if (png_ptr == NULL)
      return;

   /* Prior to 1.6.0 this would warn but then set the window_bits value. This
    * meant that negative window bits values could be selected that would cause
    * libpng to write a non-standard PNG file with raw deflate or gzip
    * compressed IDAT or ancillary chunks.  Such files can be read and there is
    * no warning on read, so this seems like a very bad idea.
    */
   if (window_bits > 15)
   {
      png_warning(png_ptr, "Only compression windows <= 32k supported by PNG");
      window_bits = 15;
   }

   else if (window_bits < 8)
   {
      png_warning(png_ptr, "Only compression windows >= 256 supported by PNG");
      window_bits = 8;
   }

   png_ptr->zlib_window_bits = window_bits;
}